

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O0

EntryPointInfo ** __thiscall
ThreadContext::RegisterEquivalentTypeCacheEntryPoint(ThreadContext *this,EntryPointInfo *entryPoint)

{
  EntryPointInfo **ppEVar1;
  EntryPointInfo *entryPoint_local;
  ThreadContext *this_local;
  
  ppEVar1 = DListBase<Js::EntryPointInfo*,RealCount>::
            PrependNode<Memory::ArenaAllocator,Js::EntryPointInfo*>
                      ((DListBase<Js::EntryPointInfo*,RealCount> *)
                       &this->equivalentTypeCacheEntryPoints,&this->equivalentTypeCacheInfoAllocator
                       ,entryPoint);
  return ppEVar1;
}

Assistant:

Js::EntryPointInfo **
ThreadContext::RegisterEquivalentTypeCacheEntryPoint(Js::EntryPointInfo * entryPoint)
{
    return equivalentTypeCacheEntryPoints.PrependNode(&equivalentTypeCacheInfoAllocator, entryPoint);
}